

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

void __thiscall
gmlc::containers::
StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
::StringMappedVector
          (StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
           *this)

{
  (this->dataStorage).csize = 0;
  (this->dataStorage).dataptr =
       (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0;
  (this->dataStorage).dataSlotsAvailable = 0;
  (this->dataStorage).dataSlotIndex = 0;
  (this->dataStorage).bsize = 0x20;
  (this->dataStorage).freeSlotsAvailable = 0;
  (this->dataStorage).freeIndex = 0;
  (this->dataStorage).freeblocks =
       (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0;
  (this->names).csize = 0;
  (this->names).dataptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->names).dataSlotsAvailable = 0;
  (this->names).dataSlotIndex = 0;
  (this->names).bsize = 0x20;
  (this->names).freeSlotsAvailable = 0;
  (this->names).freeIndex = 0;
  (this->names).freeblocks =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->lookup)._M_h._M_buckets = &(this->lookup)._M_h._M_single_bucket;
  (this->lookup)._M_h._M_bucket_count = 1;
  (this->lookup)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->lookup)._M_h._M_element_count = 0;
  (this->lookup)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->lookup)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->lookup)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit StableBlockVector(
            size_t startSize,
            const X& init =
                X{}) noexcept(std::is_nothrow_copy_constructible<X>::value) :
            csize(startSize),
            dataptr(new X*[std::max((startSize >> N) + 1, size_t{64})]),
            dataSlotsAvailable(
                std::max(static_cast<int>(startSize >> N) + 1, 64)),
            dataSlotIndex(static_cast<int>(startSize >> N)),
            bsize(static_cast<int>(startSize & cntmask))
        {
            Allocator a;
            if (startSize == 0) {
                dataptr[0] = a.allocate(blockSize);
            } else {
                for (int ii = 0; ii <= dataSlotIndex; ++ii) {
                    dataptr[ii] = a.allocate(blockSize);
                    if (ii < dataSlotIndex) {
                        for (int jj = 0; jj < static_cast<int>(blockSize);
                             ++jj) {
                            new (&dataptr[ii][jj]) X{init};
                        }
                    } else {
                        for (int jj = 0; jj < bsize; ++jj) {
                            new (&dataptr[ii][jj]) X{init};
                        }
                    }
                }
            }
        }